

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LNode.h
# Opt level: O0

void __thiscall
LNodeData<LNodeF0Stmt>::LNodeData(LNodeData<LNodeF0Stmt> *this,LNodeType type,LNodeF0Stmt *value)

{
  LNodeF0Stmt *value_local;
  LNodeType type_local;
  LNodeData<LNodeF0Stmt> *this_local;
  
  LNode::LNode(&this->super_LNode,type);
  (this->super_LNode)._vptr_LNode = (_func_int **)&PTR__LNodeData_001569b8;
  memset(&this->value,0,0x40);
  LNodeF0Stmt::LNodeF0Stmt(&this->value);
  LNodeF0Stmt::operator=(&this->value,value);
  return;
}

Assistant:

LNodeData(LNodeType type, T &&value) : LNode(type) {
        this->value = std::move(value);
    }